

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void (anonymous_namespace)::
     randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *container)

{
  pointer puVar1;
  result_type rVar2;
  ulong uVar3;
  int iVar4;
  pointer puVar5;
  uniform_int_distribution<unsigned_int> dist;
  default_random_engine eng;
  random_device rnd;
  param_type local_13b8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13b0;
  random_device local_13a8;
  
  local_13b8._M_a = 0;
  local_13b8._M_b = 0xff;
  std::random_device::random_device(&local_13a8);
  uVar3 = std::random_device::_M_getval();
  iVar4 = (int)((uVar3 & 0xffffffff) % 0x7fffffff);
  local_13b0._M_x = (unsigned_long)(iVar4 + (uint)(iVar4 == 0));
  puVar1 = (container->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (container->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&local_13b8,&local_13b0);
    *puVar5 = (uchar)rVar2;
  }
  std::random_device::~random_device(&local_13a8);
  return;
}

Assistant:

void randomize_container(C& container) {
    std::uniform_int_distribution<unsigned int> dist{
        0, std::numeric_limits<typename C::value_type>::max()};
    std::random_device rnd;
    std::default_random_engine eng(rnd());
    std::generate(container.begin(), container.end(), [&dist, &eng] { return dist(eng); });
  }